

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void kratos::generate_verilog_pkg(Generator *top,SystemVerilogCodeGenOptions *options)

{
  __node_base_ptr *this;
  size_t __n;
  pointer pcVar1;
  Generator *generator;
  string *package_name;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined1 auStack_608 [8];
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  gens;
  ios_base local_588 [272];
  undefined1 local_478 [8];
  ofstream out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450 [2];
  Generator *local_430;
  _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_420;
  _Alloc_hider local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  stringstream local_390 [16];
  ios_base local_380 [136];
  ios_base local_2f8 [264];
  undefined1 local_1f0 [8];
  UniqueGeneratorVisitor unique_visitor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  __string_type content_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  uint64_t local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  SystemVerilogCodeGenOptions *local_c0;
  string *local_b8;
  _func_int **local_b0;
  undefined1 local_a8 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  values;
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def_str;
  undefined1 local_50 [8];
  string header_filename;
  
  __n = (options->package_name)._M_string_length;
  if ((__n == (top->name)._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((options->package_name)._M_dataplus._M_p,(top->name)._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_608 = (undefined1  [8])(top->name)._M_dataplus._M_p;
    gens._M_t._M_impl._0_8_ = (top->name)._M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x33;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_608;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_478,(detail *)"Package name cannot be the same as module name ({0}",
               format_str,args);
    UserException::UserException(this_00,(string *)local_478);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  unique_visitor.super_IRVisitor._8_8_ =
       &unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  unique_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  unique_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_1f0 = (undefined1  [8])&PTR_visit_root_002b9680;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&unique_visitor.generator_map_;
  unique_visitor.generator_map_._M_t._M_impl._0_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_1f0,top);
  local_b8 = &options->package_name;
  track_generators(top);
  local_50 = (undefined1  [8])&header_filename._M_string_length;
  pcVar1 = (options->package_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (options->package_name)._M_string_length);
  std::__cxx11::string::append(local_50);
  local_b0 = (_func_int **)&PTR_visit_root_002b9680;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
  result._M_t._M_impl._0_4_ = 0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  values._32_8_ = top;
  if (unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)&unique_visitor.generator_map_) {
    def_str.field_2._8_8_ = &PTR_dispatch_node_002b9218;
    p_Var4 = unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      generator = *(Generator **)(p_Var4 + 2);
      content_1.field_2._8_1_ = options->unique_case;
      content_1.field_2._9_1_ = options->yosys_src;
      local_120[0] = &local_110;
      pcVar1 = (options->package_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar1,pcVar1 + (options->package_name)._M_string_length);
      local_100 = options->line_wrap;
      local_f8[0] = &local_e8;
      pcVar1 = (options->output_dir)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar1,pcVar1 + (options->output_dir)._M_string_length);
      local_d8 = options->extract_debug_info;
      SystemVerilogCodeGen::SystemVerilogCodeGen
                ((SystemVerilogCodeGen *)local_478,generator,
                 (SystemVerilogCodeGenOptions *)((long)&content_1.field_2 + 8));
      if (local_f8[0] != &local_e8) {
        operator_delete(local_f8[0],local_e8._M_allocated_capacity + 1);
      }
      if (local_120[0] != &local_110) {
        operator_delete(local_120[0],local_110._M_allocated_capacity + 1);
      }
      SystemVerilogCodeGen::output_module_def((SystemVerilogCodeGen *)local_478,local_430);
      std::__cxx11::stringbuf::str();
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_608);
      if (auStack_608 != (undefined1  [8])&gens._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)auStack_608,
                        gens._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      local_478 = (undefined1  [8])def_str.field_2._8_8_;
      std::__cxx11::stringstream::~stringstream(local_390);
      std::ios_base::~ios_base(local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != &local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_p != &local_3d0) {
        operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
      }
      std::
      _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._8_8_ != local_450) {
        operator_delete((void *)local_468._8_8_,local_450[0]._M_allocated_capacity + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Base_ptr)&unique_visitor.generator_map_);
  }
  if (result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&result) {
    def_str.field_2._8_8_ = &options->output_dir;
    local_d0 = _VTT;
    local_c8 = _pthread_mutex_unlock;
    p_Var4 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_c0 = options;
    do {
      local_478 = (undefined1  [8])&local_468;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_478,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      std::__cxx11::string::append((char *)local_478);
      fs::join((string *)local_a8,(string *)def_str.field_2._8_8_,(string *)local_478);
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
      }
      bVar2 = fs::exists((string *)local_a8);
      if (bVar2) {
        std::ifstream::ifstream((string *)local_478,(string *)local_a8,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_608);
        std::ostream::operator<<
                  (&gens._M_t._M_impl.super__Rb_tree_header,(streambuf *)local_468._M_local_buf);
        std::__cxx11::stringbuf::str();
        if ((_Base_ptr)def_str._M_dataplus._M_p == p_Var4[2]._M_parent) {
          if (def_str._M_dataplus._M_p == (pointer)0x0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp(local_78,*(void **)(p_Var4 + 2),(size_t)def_str._M_dataplus._M_p);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        if (local_78 != &def_str._M_string_length) {
          operator_delete(local_78,def_str._M_string_length + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_608);
        std::ios_base::~ios_base(local_588);
        std::ifstream::~ifstream(local_478);
        options = local_c0;
        if (!bVar2) goto LAB_00207d3b;
      }
      else {
LAB_00207d3b:
        std::ofstream::ofstream((ostream *)local_478,(string *)local_a8,_S_trunc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_478,*(char **)(p_Var4 + 2),(long)p_Var4[2]._M_parent);
        Context::get_generators_by_name
                  ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)auStack_608,*(Context **)(values._32_8_ + 0xf8),(string *)(p_Var4 + 1));
        for (p_Var5 = gens._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var5 != (_Rb_tree_node_base *)&gens;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          if (*(char *)(*(long *)(p_Var5 + 1) + 0xbc) == '\x01') {
            std::__cxx11::string::_M_assign((string *)(*(long *)(p_Var5 + 1) + 0xc0));
          }
        }
        std::
        _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     *)auStack_608);
        local_478 = (undefined1  [8])local_d0;
        *(undefined8 *)(local_478 + (&local_d0->_M_allocated_capacity)[-3]) = local_c8;
        std::filebuf::~filebuf((filebuf *)&out);
        std::ios_base::~ios_base(local_380);
      }
      if (local_a8 != (undefined1  [8])&values.first._M_string_length) {
        operator_delete((void *)local_a8,values.first._M_string_length + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)&result);
  }
  this = &unique_visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
  if (options->extract_debug_info != false) {
    output_pkg_debug_info
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
                *)this,options);
  }
  fs::join((string *)local_478,&options->output_dir,(string *)local_50);
  package_name = local_b8;
  std::__cxx11::string::operator=((string *)local_50,(string *)local_478);
  if (local_478 != (undefined1  [8])&local_468) {
    operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
  }
  generate_sv_package_header
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_a8,(Generator *)values._32_8_,package_name,true);
  local_78 = &def_str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_a8,values.first._M_dataplus._M_p + (long)local_a8);
  bVar2 = fs::exists((string *)local_50);
  if (bVar2) {
    std::ifstream::ifstream(local_478,(string *)local_50,_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_608);
    std::ostream::operator<<
              (&gens._M_t._M_impl.super__Rb_tree_header,(streambuf *)local_468._M_local_buf);
    std::__cxx11::stringbuf::str();
    if (content_1._M_dataplus._M_p == def_str._M_dataplus._M_p) {
      if (content_1._M_dataplus._M_p == (pointer)0x0) {
        bVar2 = true;
      }
      else {
        iVar3 = bcmp((void *)result._M_t._M_impl.super__Rb_tree_header._M_node_count,local_78,
                     (size_t)content_1._M_dataplus._M_p);
        bVar2 = iVar3 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if ((size_type *)result._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        &content_1._M_string_length) {
      operator_delete((void *)result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      content_1._M_string_length + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)auStack_608);
    std::ios_base::~ios_base(local_588);
    std::ifstream::~ifstream(local_478);
    if (bVar2) goto LAB_00208010;
  }
  std::ofstream::ofstream(local_478,(string *)local_50,_S_trunc|_S_out|_S_in);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_478,(char *)local_78,(long)def_str._M_dataplus._M_p);
  local_478 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_478 + (&_VTT->_M_allocated_capacity)[-3]) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&out);
  std::ios_base::~ios_base(local_380);
LAB_00208010:
  if (local_78 != &def_str._M_string_length) {
    operator_delete(local_78,def_str._M_string_length + 1);
  }
  if (local_a8 != (undefined1  [8])&values.first._M_string_length) {
    operator_delete((void *)local_a8,values.first._M_string_length + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (local_50 != (undefined1  [8])&header_filename._M_string_length) {
    operator_delete((void *)local_50,header_filename._M_string_length + 1);
  }
  local_1f0 = (undefined1  [8])local_b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
               *)this);
  local_1f0 = (undefined1  [8])&PTR_visit_root_002b4518;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&unique_visitor.super_IRVisitor.level);
  return;
}

Assistant:

void generate_verilog_pkg(Generator* top, SystemVerilogCodeGenOptions options) {
    // input check
    if (options.package_name == top->name) {
        throw UserException(
            ::format("Package name cannot be the same as module name ({0}", top->name));
    }
    // this pass assumes that all the generators has been uniquified
    // first get all the unique generators
    UniqueGeneratorVisitor unique_visitor;
    // this can be parallelized
    unique_visitor.visit_generator_root_p(top);
    auto const& generator_map = unique_visitor.generator_map();
    track_generators(top);

    // we use header_name + ".svh"
    std::string header_filename = options.package_name + ".svh";
    std::map<std::string, std::string> result;
    for (const auto& [module_name, module_gen] : generator_map) {
        SystemVerilogCodeGen codegen(module_gen, options);
        result.emplace(module_name, codegen.str());
    }
    // write out the content to the output_dir
    // we assume output_dir already exists
    // notice that if the content is the same, we don't override to avoid modifying the timestamps
    // this will help with incremental compile in the downstream tools, typically the commercial
    // ones
    // unfortunately verilator doesn't support incremental build. see
    // https://www.veripool.org/boards/2/topics/2822
    for (auto const& [module_name, src] : result) {
        auto path = kratos::fs::join(options.output_dir, module_name + ".sv");
        if (kratos::fs::exists(path)) {
            // load up the file
            std::ifstream in(path);
            std::stringstream content_stream;
            content_stream << in.rdbuf();
            std::string content = content_stream.str();
            if (content == src) continue;
        }
        // truncate mode
        std::ofstream out(path, std::ios::trunc);
        out << src;
        // tell the system where it went, if allowed
        auto gens = top->context()->get_generators_by_name(module_name);
        for (auto const& gen : gens) {
            if (gen->debug) gen->verilog_fn = path;
        }
    }
    // output debug info as well, if required
    if (options.extract_debug_info) {
        output_pkg_debug_info(generator_map, options);
    }

    header_filename = kratos::fs::join(options.output_dir, header_filename);

    // compare it with the old one, if exists. this is for incremental build
    auto values = generate_sv_package_header(top, options.package_name, true);
    auto def_str = values.first;
    if (kratos::fs::exists(header_filename)) {
        std::ifstream in(header_filename);
        std::stringstream content_stream;
        content_stream << in.rdbuf();
        auto content = content_stream.str();
        if (content == def_str) {
            return;
        }
    }
    std::ofstream out(header_filename, std::ios::in | std::ios::out | std::ios::trunc);
    out << def_str;
}